

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O3

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetDiagnosticPropertyData
          (IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,
          IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *diagnosticData)

{
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE pIVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGE_RESULT IVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (((diagnosticData == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0 ||
        iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) ||
      (diagnosticData->diagnosticCreationTimeUtc == (char *)0x0)) ||
     (diagnosticData->diagnosticId == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else {
      if (diagnosticData == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
        pcVar4 = (char *)0x0;
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar4 = diagnosticData->diagnosticId;
        pcVar5 = diagnosticData->diagnosticCreationTimeUtc;
      }
      IVar3 = IOTHUB_MESSAGE_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetDiagnosticPropertyData",0x378,1,
                "Invalid argument (iotHubMessageHandle=%p, diagnosticData=%p, diagnosticData->diagnosticId=%p, diagnosticData->diagnosticCreationTimeUtc=%p)"
                ,iotHubMessageHandle,diagnosticData,pcVar4,pcVar5);
    }
  }
  else {
    if (iotHubMessageHandle->diagnosticData != (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0)
    {
      DestroyDiagnosticPropertyData(iotHubMessageHandle->diagnosticData);
      iotHubMessageHandle->diagnosticData = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0;
    }
    pIVar1 = CloneDiagnosticPropertyData(diagnosticData);
    iotHubMessageHandle->diagnosticData = pIVar1;
    IVar3 = IOTHUB_MESSAGE_OK;
    if (pIVar1 == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      IVar3 = IOTHUB_MESSAGE_ERROR;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"IoTHubMessage_SetDiagnosticPropertyData",0x385,1,
                  "Failed saving a copy of diagnosticData");
      }
    }
  }
  return IVar3;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetDiagnosticPropertyData(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* diagnosticData)
{
    IOTHUB_MESSAGE_RESULT result;
    if (iotHubMessageHandle == NULL ||
        diagnosticData == NULL ||
        diagnosticData->diagnosticCreationTimeUtc == NULL ||
        diagnosticData->diagnosticId == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle=%p, diagnosticData=%p, diagnosticData->diagnosticId=%p, diagnosticData->diagnosticCreationTimeUtc=%p)",
            iotHubMessageHandle, diagnosticData,
            diagnosticData == NULL ? NULL : diagnosticData->diagnosticId,
            diagnosticData == NULL ? NULL : diagnosticData->diagnosticCreationTimeUtc);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        if (iotHubMessageHandle->diagnosticData != NULL)
        {
            DestroyDiagnosticPropertyData(iotHubMessageHandle->diagnosticData);
            iotHubMessageHandle->diagnosticData = NULL;
        }

        if ((iotHubMessageHandle->diagnosticData = CloneDiagnosticPropertyData(diagnosticData)) == NULL)
        {
            LogError("Failed saving a copy of diagnosticData");
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}